

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

void __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler3>::
ReadBounds<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler3>::VarHandler>
          (NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler3> *this)

{
  char *pcVar1;
  int iVar2;
  TextReader<fmt::Locale> *this_00;
  
  TextReader<fmt::Locale>::ReadTillEndOfLine(*(TextReader<fmt::Locale> **)this);
  iVar2 = 0;
  if (0 < **(int **)(this + 8)) {
    iVar2 = **(int **)(this + 8);
  }
  do {
    if (iVar2 == 0) {
      return;
    }
    this_00 = *(TextReader<fmt::Locale> **)this;
    pcVar1 = (this_00->super_ReaderBase).ptr_;
    (this_00->super_ReaderBase).token_ = pcVar1;
    (this_00->super_ReaderBase).ptr_ = pcVar1 + 1;
    switch(*pcVar1) {
    case '0':
      TextReader<fmt::Locale>::ReadDouble(this_00);
      this_00 = *(TextReader<fmt::Locale> **)this;
    case '1':
    case '2':
    case '4':
      TextReader<fmt::Locale>::ReadDouble(this_00);
      break;
    case '3':
      break;
    case '5':
      pcVar1 = "(input):12:1: COMPL bound type is invalid for variables";
      goto LAB_0019f1d8;
    default:
      pcVar1 = "(input):12:1: expected bound";
LAB_0019f1d8:
      TextReader<fmt::Locale>::ReportError<>(this_00,(CStringRef)(pcVar1 + 0xe));
    }
    TextReader<fmt::Locale>::ReadTillEndOfLine(*(TextReader<fmt::Locale> **)this);
    iVar2 = iVar2 + -1;
  } while( true );
}

Assistant:

void NLReader<Reader, Handler>::ReadBounds() {
  enum BoundType {
    RANGE,     // Both lower and upper bounds: l <= body <= u.
    UPPER,     // Only upper bound: body <= u.
    LOWER,     // Only lower bound: l <= body.
    FREE,      // No constraints on body (free variable or constraint).
    CONSTANT,  // Equal to constant: body = c.
    COMPL      // Body complements variable v[i - 1].
  };
  reader_.ReadTillEndOfLine();
  double lb = 0, ub = 0;
  BoundHandler bh(*this);
  int num_bounds = bh.num_items();
  double infinity = INFINITY;
  for (int i = 0; i < num_bounds; ++i) {
    switch (reader_.ReadChar() - '0') {
    case RANGE:
      lb = reader_.ReadDouble();
      ub = reader_.ReadDouble();
      break;
    case UPPER:
      lb = -infinity;
      ub = reader_.ReadDouble();
      break;
    case LOWER:
      lb = reader_.ReadDouble();
      ub = infinity;
      break;
    case FREE:
      lb = -infinity;
      ub =  infinity;
      break;
    case CONSTANT:
      lb = ub = reader_.ReadDouble();
      break;
    case COMPL:
      if (BoundHandler::TYPE == CON) {
        int flags = reader_.template ReadInt<int>();
        int var_index = reader_.ReadUInt();
        // Don't use NLReader::ReadUInt(int, int) as num_vars + 1 may overflow.
        if (var_index == 0 || var_index > header_.num_vars)
          reader_.ReportError("integer {} out of bounds", var_index);
        --var_index;
        int mask = ComplInfo::INF_LB | ComplInfo::INF_UB;
        handler_.OnComplementarity(i, var_index, ComplInfo(flags & mask));
        reader_.ReadTillEndOfLine();
        continue;
      }
      reader_.ReportError("COMPL bound type is invalid for variables");
      break;
    default:
      reader_.ReportError("expected bound");
    }
    reader_.ReadTillEndOfLine();
    bh.SetBounds(i, lb, ub);
  }
}